

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
          (QMovableArrayOps<QItemSelectionRange> *this,qsizetype i,QItemSelectionRange *args)

{
  qsizetype *pqVar1;
  QItemSelectionRange **ppQVar2;
  Data *pDVar3;
  QItemSelectionRange *pQVar4;
  QPersistentModelIndex QVar5;
  QPersistentModelIndex QVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  bool bVar8;
  Inserter local_60;
  QItemSelectionRange local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QItemSelectionRange>).
           super_QArrayDataPointer<QItemSelectionRange>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QItemSelectionRange>).
        super_QArrayDataPointer<QItemSelectionRange>.size == i) {
      qVar7 = QArrayDataPointer<QItemSelectionRange>::freeSpaceAtEnd
                        ((QArrayDataPointer<QItemSelectionRange> *)this);
      if (qVar7 == 0) goto LAB_005342aa;
      QItemSelectionRange::QItemSelectionRange
                ((this->super_QGenericArrayOps<QItemSelectionRange>).
                 super_QArrayDataPointer<QItemSelectionRange>.ptr +
                 (this->super_QGenericArrayOps<QItemSelectionRange>).
                 super_QArrayDataPointer<QItemSelectionRange>.size,args);
LAB_005343b7:
      pqVar1 = &(this->super_QGenericArrayOps<QItemSelectionRange>).
                super_QArrayDataPointer<QItemSelectionRange>.size;
      *pqVar1 = *pqVar1 + 1;
      goto LAB_00534376;
    }
LAB_005342aa:
    if (i == 0) {
      qVar7 = QArrayDataPointer<QItemSelectionRange>::freeSpaceAtBegin
                        ((QArrayDataPointer<QItemSelectionRange> *)this);
      if (qVar7 != 0) {
        QItemSelectionRange::QItemSelectionRange
                  ((this->super_QGenericArrayOps<QItemSelectionRange>).
                   super_QArrayDataPointer<QItemSelectionRange>.ptr + -1,args);
        ppQVar2 = &(this->super_QGenericArrayOps<QItemSelectionRange>).
                   super_QArrayDataPointer<QItemSelectionRange>.ptr;
        *ppQVar2 = *ppQVar2 + -1;
        goto LAB_005343b7;
      }
    }
  }
  local_38.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelectionRange::QItemSelectionRange(&local_38,args);
  bVar8 = (this->super_QGenericArrayOps<QItemSelectionRange>).
          super_QArrayDataPointer<QItemSelectionRange>.size != 0;
  QArrayDataPointer<QItemSelectionRange>::detachAndGrow
            ((QArrayDataPointer<QItemSelectionRange> *)this,(uint)(i == 0 && bVar8),1,
             (QItemSelectionRange **)0x0,(QArrayDataPointer<QItemSelectionRange> *)0x0);
  QVar6.d = local_38.br.d;
  QVar5.d = local_38.tl.d;
  if (i == 0 && bVar8) {
    pQVar4 = (this->super_QGenericArrayOps<QItemSelectionRange>).
             super_QArrayDataPointer<QItemSelectionRange>.ptr;
    local_38.tl.d = (QPersistentModelIndexData *)0x0;
    pQVar4[-1].tl.d = QVar5.d;
    local_38.br.d = (QPersistentModelIndexData *)0x0;
    pQVar4[-1].br.d = QVar6.d;
    (this->super_QGenericArrayOps<QItemSelectionRange>).super_QArrayDataPointer<QItemSelectionRange>
    .ptr = pQVar4 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<QItemSelectionRange>).
              super_QArrayDataPointer<QItemSelectionRange>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&local_60,(QArrayDataPointer<QItemSelectionRange> *)this,i,1);
    QVar6.d = local_38.br.d;
    QVar5.d = local_38.tl.d;
    local_38.tl.d = (QPersistentModelIndexData *)0x0;
    ((local_60.displaceFrom)->tl).d = QVar5.d;
    local_38.br.d = (QPersistentModelIndexData *)0x0;
    ((local_60.displaceFrom)->br).d = QVar6.d;
    local_60.displaceFrom = local_60.displaceFrom + 1;
    Inserter::~Inserter(&local_60);
  }
  QItemSelectionRange::~QItemSelectionRange(&local_38);
LAB_00534376:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }